

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int i;
  int iVar13;
  uint uVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  uint uVar16;
  Allocator *pAVar17;
  void *pvVar18;
  long lVar19;
  ulong uVar20;
  void *pvVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  void *pvVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float in_XMM1_Da;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar59;
  undefined1 auVar58 [16];
  void *ptr;
  void *local_40;
  Allocator *local_38;
  
  iVar13 = this->operation;
  switch(iVar13) {
  case 0:
    iVar13 = reduction_op<std::plus<float>,std::plus<float>>
                       (bottom_blob,top_blob,this->coeff,this->dim,in_XMM1_Da,opt);
    return iVar13;
  case 1:
    iVar13 = this->dim;
    fVar2 = this->coeff;
    uVar16 = bottom_blob->w;
    lVar31 = (long)(int)uVar16;
    uVar32 = (ulong)uVar16;
    uVar14 = bottom_blob->h;
    uVar4 = bottom_blob->c;
    lVar15 = (long)(int)uVar4;
    sVar6 = bottom_blob->elemsize;
    if (iVar13 == 0) {
      pAVar17 = opt->blob_allocator;
      uVar22 = 1;
      goto LAB_00137293;
    }
    switch(iVar13) {
    default:
      goto switchD_00137076_caseD_0;
    case 1:
      pAVar17 = opt->blob_allocator;
      uVar22 = uVar4;
LAB_00137293:
      Mat::create(top_blob,uVar22,sVar6,pAVar17);
      goto switchD_00137076_caseD_0;
    case 2:
      pAVar17 = opt->blob_allocator;
      uVar22 = uVar4;
      uVar24 = uVar14;
      break;
    case -2:
      pAVar17 = opt->blob_allocator;
      uVar22 = uVar14;
      uVar24 = uVar16;
      break;
    case -1:
      pAVar17 = opt->blob_allocator;
      uVar22 = uVar16;
      goto LAB_00137293;
    }
    Mat::create(top_blob,uVar24,uVar22,sVar6,pAVar17);
switchD_00137076_caseD_0:
    pvVar21 = top_blob->data;
    if (pvVar21 == (void *)0x0) {
      return -100;
    }
    if (top_blob->cstep * (long)top_blob->c == 0) {
      return -100;
    }
    uVar22 = uVar14 * uVar16;
    if (iVar13 != 0) {
      switch(iVar13) {
      default:
        return 0;
      case 1:
        if ((int)uVar4 < 1) {
          return 0;
        }
        sVar6 = bottom_blob->elemsize;
        sVar7 = bottom_blob->cstep;
        pvVar18 = bottom_blob->data;
        lVar31 = 0;
        do {
          fVar48 = 0.0;
          if (0 < (int)uVar22) {
            uVar32 = 0;
            do {
              fVar48 = fVar48 + ABS(*(float *)((long)pvVar18 + uVar32 * 4));
              uVar32 = uVar32 + 1;
            } while (uVar22 != uVar32);
          }
          *(float *)((long)pvVar21 + lVar31 * 4) = fVar48 * fVar2;
          lVar31 = lVar31 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
        } while (lVar31 != lVar15);
        return 0;
      case 2:
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar18 = bottom_blob->data;
        sVar6 = bottom_blob->elemsize;
        iVar13 = top_blob->w;
        sVar7 = top_blob->elemsize;
        sVar5 = bottom_blob->cstep;
        lVar26 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar25 = 0;
            pvVar28 = pvVar18;
            do {
              fVar48 = 0.0;
              if (0 < (int)uVar16) {
                uVar23 = 0;
                do {
                  fVar48 = fVar48 + ABS(*(float *)((long)pvVar28 + uVar23 * 4));
                  uVar23 = uVar23 + 1;
                } while (uVar32 != uVar23);
              }
              *(float *)((long)pvVar21 + uVar25 * 4 + (long)iVar13 * sVar7 * lVar26) =
                   fVar48 * fVar2;
              uVar25 = uVar25 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
            } while (uVar25 != uVar14);
          }
          lVar26 = lVar26 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar5);
        } while (lVar26 != lVar15);
        return 0;
      case -2:
        uVar16 = (int)top_blob->cstep * top_blob->c;
        if (0 < (int)uVar16) {
          memset(pvVar21,0,(ulong)uVar16 << 2);
        }
        if (0 < (int)uVar4) {
          pvVar18 = bottom_blob->data;
          sVar6 = bottom_blob->elemsize;
          sVar7 = bottom_blob->cstep;
          pvVar28 = top_blob->data;
          lVar31 = 0;
          do {
            if (0 < (int)uVar22) {
              uVar32 = 0;
              do {
                *(float *)((long)pvVar28 + uVar32 * 4) =
                     ABS(*(float *)((long)pvVar18 + uVar32 * 4)) +
                     *(float *)((long)pvVar28 + uVar32 * 4);
                uVar32 = uVar32 + 1;
              } while (uVar22 != uVar32);
            }
            lVar31 = lVar31 + 1;
            pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
          } while (lVar31 != lVar15);
        }
        if ((int)uVar22 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          *(float *)((long)pvVar21 + uVar32 * 4) = *(float *)((long)pvVar21 + uVar32 * 4) * fVar2;
          uVar32 = uVar32 + 1;
        } while (uVar22 != uVar32);
        return 0;
      case -1:
        goto switchD_00137334_caseD_ffffffff;
      }
    }
    if (uVar4 == 0) {
      return -100;
    }
    pAVar17 = opt->workspace_allocator;
    uVar32 = sVar6 * lVar15 + 3 & 0xfffffffffffffffc;
    if (pAVar17 == (Allocator *)0x0) {
      local_40 = (void *)0x0;
      iVar13 = posix_memalign(&local_40,0x10,uVar32 + 4);
      pvVar21 = (void *)0x0;
      if (iVar13 == 0) {
        pvVar21 = local_40;
      }
    }
    else {
      iVar13 = (*pAVar17->_vptr_Allocator[2])();
      pvVar21 = (void *)CONCAT44(extraout_var_00,iVar13);
    }
    *(undefined4 *)((long)pvVar21 + uVar32) = 1;
    if ((int)uVar4 < 1) {
      auVar38 = ZEXT816(0);
    }
    else {
      sVar6 = bottom_blob->elemsize;
      sVar7 = bottom_blob->cstep;
      pvVar18 = bottom_blob->data;
      lVar31 = 0;
      do {
        fVar48 = 0.0;
        if (0 < (int)uVar22) {
          uVar25 = 0;
          do {
            fVar48 = fVar48 + ABS(*(float *)((long)pvVar18 + uVar25 * 4));
            uVar25 = uVar25 + 1;
          } while (uVar22 != uVar25);
        }
        *(float *)((long)pvVar21 + lVar31 * 4) = fVar48;
        lVar31 = lVar31 + 1;
        pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
      } while (lVar31 != lVar15);
      auVar38 = ZEXT816(0);
      lVar31 = 0;
      do {
        auVar38._0_4_ = auVar38._0_4_ + *(float *)((long)pvVar21 + lVar31 * 4);
        lVar31 = lVar31 + 1;
      } while (lVar15 != lVar31);
    }
    *(float *)top_blob->data = auVar38._0_4_ * fVar2;
    LOCK();
    piVar1 = (int *)((long)pvVar21 + uVar32);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return 0;
    }
    if (pAVar17 != (Allocator *)0x0) {
      (*pAVar17->_vptr_Allocator[3])(pAVar17,pvVar21);
      return 0;
    }
    goto LAB_001396b3;
  case 2:
    iVar13 = this->dim;
    fVar2 = this->coeff;
    uVar16 = bottom_blob->w;
    lVar31 = (long)(int)uVar16;
    uVar32 = (ulong)uVar16;
    uVar14 = bottom_blob->h;
    uVar4 = bottom_blob->c;
    lVar15 = (long)(int)uVar4;
    sVar6 = bottom_blob->elemsize;
    if (iVar13 == 0) {
      pAVar17 = opt->blob_allocator;
      uVar22 = 1;
      goto LAB_001370e9;
    }
    switch(iVar13) {
    default:
      goto switchD_00136f67_caseD_0;
    case 1:
      pAVar17 = opt->blob_allocator;
      uVar22 = uVar4;
LAB_001370e9:
      Mat::create(top_blob,uVar22,sVar6,pAVar17);
      goto switchD_00136f67_caseD_0;
    case 2:
      pAVar17 = opt->blob_allocator;
      uVar22 = uVar4;
      uVar24 = uVar14;
      break;
    case -2:
      pAVar17 = opt->blob_allocator;
      uVar22 = uVar14;
      uVar24 = uVar16;
      break;
    case -1:
      pAVar17 = opt->blob_allocator;
      uVar22 = uVar16;
      goto LAB_001370e9;
    }
    Mat::create(top_blob,uVar24,uVar22,sVar6,pAVar17);
switchD_00136f67_caseD_0:
    pvVar21 = top_blob->data;
    if (pvVar21 == (void *)0x0) {
      return -100;
    }
    if (top_blob->cstep * (long)top_blob->c == 0) {
      return -100;
    }
    uVar22 = uVar14 * uVar16;
    if (iVar13 != 0) {
      switch(iVar13) {
      default:
        return 0;
      case 1:
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar18 = bottom_blob->data;
        sVar6 = bottom_blob->elemsize;
        sVar7 = bottom_blob->cstep;
        lVar31 = 0;
        do {
          fVar48 = 0.0;
          if (0 < (int)uVar22) {
            uVar32 = 0;
            do {
              fVar3 = *(float *)((long)pvVar18 + uVar32 * 4);
              fVar48 = fVar48 + fVar3 * fVar3;
              uVar32 = uVar32 + 1;
            } while (uVar22 != uVar32);
          }
          *(float *)((long)pvVar21 + lVar31 * 4) = fVar48 * fVar2;
          lVar31 = lVar31 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
        } while (lVar31 != lVar15);
        return 0;
      case 2:
        if ((int)uVar4 < 1) {
          return 0;
        }
        sVar6 = bottom_blob->elemsize;
        iVar13 = top_blob->w;
        sVar7 = top_blob->elemsize;
        sVar5 = bottom_blob->cstep;
        pvVar18 = bottom_blob->data;
        lVar26 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar25 = 0;
            pvVar28 = pvVar18;
            do {
              auVar33 = ZEXT816(0);
              if (0 < (int)uVar16) {
                uVar23 = 0;
                do {
                  fVar48 = *(float *)((long)pvVar28 + uVar23 * 4);
                  auVar33._0_4_ = auVar33._0_4_ + fVar48 * fVar48;
                  uVar23 = uVar23 + 1;
                } while (uVar32 != uVar23);
              }
              *(float *)((long)pvVar21 + uVar25 * 4 + (long)iVar13 * sVar7 * lVar26) =
                   auVar33._0_4_ * fVar2;
              uVar25 = uVar25 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
            } while (uVar25 != uVar14);
          }
          lVar26 = lVar26 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar5);
        } while (lVar26 != lVar15);
        return 0;
      case -2:
        uVar16 = (int)top_blob->cstep * top_blob->c;
        if (0 < (int)uVar16) {
          memset(pvVar21,0,(ulong)uVar16 << 2);
        }
        if (0 < (int)uVar4) {
          sVar6 = bottom_blob->elemsize;
          sVar7 = bottom_blob->cstep;
          pvVar18 = bottom_blob->data;
          pvVar28 = top_blob->data;
          lVar31 = 0;
          do {
            if (0 < (int)uVar22) {
              uVar32 = 0;
              do {
                fVar48 = *(float *)((long)pvVar18 + uVar32 * 4);
                *(float *)((long)pvVar28 + uVar32 * 4) =
                     fVar48 * fVar48 + *(float *)((long)pvVar28 + uVar32 * 4);
                uVar32 = uVar32 + 1;
              } while (uVar22 != uVar32);
            }
            lVar31 = lVar31 + 1;
            pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
          } while (lVar31 != lVar15);
        }
        if ((int)uVar22 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          *(float *)((long)pvVar21 + uVar32 * 4) = *(float *)((long)pvVar21 + uVar32 * 4) * fVar2;
          uVar32 = uVar32 + 1;
        } while (uVar22 != uVar32);
        return 0;
      case -1:
        goto switchD_0013718a_caseD_ffffffff;
      }
    }
    if (uVar4 == 0) {
      return -100;
    }
    pAVar17 = opt->workspace_allocator;
    uVar32 = sVar6 * lVar15 + 3 & 0xfffffffffffffffc;
    if (pAVar17 == (Allocator *)0x0) {
      local_40 = (void *)0x0;
      iVar13 = posix_memalign(&local_40,0x10,uVar32 + 4);
      pvVar21 = (void *)0x0;
      if (iVar13 == 0) {
        pvVar21 = local_40;
      }
    }
    else {
      iVar13 = (*pAVar17->_vptr_Allocator[2])();
      pvVar21 = (void *)CONCAT44(extraout_var,iVar13);
    }
    *(undefined4 *)((long)pvVar21 + uVar32) = 1;
    if ((int)uVar4 < 1) {
      auVar37 = ZEXT816(0);
    }
    else {
      pvVar18 = bottom_blob->data;
      sVar6 = bottom_blob->elemsize;
      sVar7 = bottom_blob->cstep;
      lVar31 = 0;
      do {
        fVar48 = 0.0;
        if (0 < (int)uVar22) {
          uVar25 = 0;
          do {
            fVar3 = *(float *)((long)pvVar18 + uVar25 * 4);
            fVar48 = fVar48 + fVar3 * fVar3;
            uVar25 = uVar25 + 1;
          } while (uVar22 != uVar25);
        }
        *(float *)((long)pvVar21 + lVar31 * 4) = fVar48;
        lVar31 = lVar31 + 1;
        pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
      } while (lVar31 != lVar15);
      auVar37 = ZEXT816(0);
      lVar31 = 0;
      do {
        auVar37._0_4_ = auVar37._0_4_ + *(float *)((long)pvVar21 + lVar31 * 4);
        lVar31 = lVar31 + 1;
      } while (lVar15 != lVar31);
    }
    *(float *)top_blob->data = auVar37._0_4_ * fVar2;
    LOCK();
    piVar1 = (int *)((long)pvVar21 + uVar32);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return 0;
    }
    if (pAVar17 != (Allocator *)0x0) {
      (*pAVar17->_vptr_Allocator[3])(pAVar17,pvVar21);
      return 0;
    }
    goto LAB_001396b3;
  case 3:
    iVar13 = reduction_op<std::plus<float>,std::plus<float>>
                       (bottom_blob,top_blob,this->coeff,this->dim,in_XMM1_Da,opt);
    if (iVar13 != 0) {
      return -100;
    }
    if (this->dim + 2U < 5) {
      uVar16 = bottom_blob->w;
      uVar14 = bottom_blob->h;
      uVar4 = bottom_blob->c;
      uVar22 = uVar14 * uVar16;
      switch(this->dim) {
      case 0:
        *(float *)top_blob->data = *top_blob->data / (float)(int)(uVar4 * uVar22);
        break;
      case 1:
        if (0 < (int)uVar4) {
          pvVar21 = top_blob->data;
          uVar32 = 0;
          do {
            *(float *)((long)pvVar21 + uVar32 * 4) =
                 *(float *)((long)pvVar21 + uVar32 * 4) * (1.0 / (float)(int)uVar22);
            uVar32 = uVar32 + 1;
          } while (uVar4 != uVar32);
        }
        break;
      case 2:
        if (0 < (int)uVar4) {
          sVar6 = top_blob->cstep;
          sVar7 = top_blob->elemsize;
          pvVar21 = top_blob->data;
          uVar32 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar25 = 0;
              do {
                *(float *)((long)pvVar21 + uVar25 * 4) =
                     *(float *)((long)pvVar21 + uVar25 * 4) * (1.0 / (float)(int)uVar16);
                uVar25 = uVar25 + 1;
              } while (uVar14 != uVar25);
            }
            uVar32 = uVar32 + 1;
            pvVar21 = (void *)((long)pvVar21 + sVar6 * sVar7);
          } while (uVar32 != uVar4);
        }
        break;
      case -2:
        if (0 < (int)uVar22) {
          pvVar21 = top_blob->data;
          uVar32 = 0;
          do {
            *(float *)((long)pvVar21 + uVar32 * 4) =
                 *(float *)((long)pvVar21 + uVar32 * 4) * (1.0 / (float)(int)uVar4);
            uVar32 = uVar32 + 1;
          } while (uVar22 != uVar32);
        }
        break;
      case -1:
        if (0 < (int)uVar16) {
          pvVar21 = top_blob->data;
          uVar32 = 0;
          do {
            *(float *)((long)pvVar21 + uVar32 * 4) =
                 *(float *)((long)pvVar21 + uVar32 * 4) * (1.0 / (float)(int)(uVar14 * uVar4));
            uVar32 = uVar32 + 1;
          } while (uVar16 != uVar32);
        }
      }
    }
    iVar13 = this->operation;
  }
  if (iVar13 != 6) {
    if (iVar13 != 5) {
      if (iVar13 != 4) {
        return 0;
      }
      iVar13 = this->dim;
      fVar2 = this->coeff;
      uVar16 = bottom_blob->w;
      lVar31 = (long)(int)uVar16;
      uVar25 = (ulong)uVar16;
      uVar14 = bottom_blob->h;
      uVar4 = bottom_blob->c;
      lVar15 = (long)(int)uVar4;
      uVar32 = bottom_blob->elemsize;
      if (iVar13 == 0) {
        pAVar17 = opt->blob_allocator;
        uVar22 = 1;
        goto LAB_00137c6d;
      }
      switch(iVar13) {
      default:
        goto switchD_0013757f_caseD_0;
      case 1:
        pAVar17 = opt->blob_allocator;
        uVar22 = uVar4;
LAB_00137c6d:
        Mat::create(top_blob,uVar22,uVar32,pAVar17);
        goto switchD_0013757f_caseD_0;
      case 2:
        pAVar17 = opt->blob_allocator;
        uVar22 = uVar4;
        uVar24 = uVar14;
        break;
      case -2:
        pAVar17 = opt->blob_allocator;
        uVar22 = uVar14;
        uVar24 = uVar16;
        break;
      case -1:
        pAVar17 = opt->blob_allocator;
        uVar22 = uVar16;
        goto LAB_00137c6d;
      }
      Mat::create(top_blob,uVar24,uVar22,uVar32,pAVar17);
switchD_0013757f_caseD_0:
      auVar41 = _DAT_0015d310;
      auVar12 = _DAT_0015d300;
      auVar58 = _DAT_0015d1a0;
      pvVar21 = top_blob->data;
      if (pvVar21 == (void *)0x0) {
        return -100;
      }
      if (top_blob->cstep * (long)top_blob->c == 0) {
        return -100;
      }
      uVar22 = uVar14 * uVar16;
      uVar23 = (ulong)uVar22;
      if (iVar13 != 0) {
        switch(iVar13) {
        default:
          goto switchD_00137f5a_caseD_0;
        case 1:
          if ((int)uVar4 < 1) {
            return 0;
          }
          sVar6 = bottom_blob->elemsize;
          sVar7 = bottom_blob->cstep;
          pvVar18 = bottom_blob->data;
          lVar31 = 0;
          do {
            fVar48 = -3.4028235e+38;
            if (0 < (int)uVar22) {
              uVar32 = 0;
              fVar48 = -3.4028235e+38;
              do {
                fVar3 = *(float *)((long)pvVar18 + uVar32 * 4);
                if (fVar48 <= fVar3) {
                  fVar48 = fVar3;
                }
                uVar32 = uVar32 + 1;
              } while (uVar23 != uVar32);
            }
            *(float *)((long)pvVar21 + lVar31 * 4) = fVar48 * fVar2;
            lVar31 = lVar31 + 1;
            pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
          } while (lVar31 != lVar15);
          return 0;
        case 2:
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar18 = bottom_blob->data;
          sVar6 = bottom_blob->elemsize;
          iVar13 = top_blob->w;
          sVar7 = top_blob->elemsize;
          sVar5 = bottom_blob->cstep;
          lVar26 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar32 = 0;
              pvVar28 = pvVar18;
              do {
                fVar48 = -3.4028235e+38;
                if (0 < (int)uVar16) {
                  uVar23 = 0;
                  fVar48 = -3.4028235e+38;
                  do {
                    fVar3 = *(float *)((long)pvVar28 + uVar23 * 4);
                    if (fVar48 <= fVar3) {
                      fVar48 = fVar3;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar25 != uVar23);
                }
                *(float *)((long)pvVar21 + uVar32 * 4 + (long)iVar13 * sVar7 * lVar26) =
                     fVar48 * fVar2;
                uVar32 = uVar32 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
              } while (uVar32 != uVar14);
            }
            lVar26 = lVar26 + 1;
            pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar5);
          } while (lVar26 != lVar15);
          return 0;
        case -2:
          uVar16 = (int)top_blob->cstep * top_blob->c;
          if (0 < (int)uVar16) {
            lVar31 = (ulong)uVar16 - 1;
            auVar36._8_4_ = (int)lVar31;
            auVar36._0_8_ = lVar31;
            auVar36._12_4_ = (int)((ulong)lVar31 >> 0x20);
            uVar32 = 0;
            auVar36 = auVar36 ^ _DAT_0015d1a0;
            do {
              auVar51._8_4_ = (int)uVar32;
              auVar51._0_8_ = uVar32;
              auVar51._12_4_ = (int)(uVar32 >> 0x20);
              auVar47 = (auVar51 | auVar41) ^ auVar58;
              iVar13 = auVar36._4_4_;
              if ((bool)(~(auVar47._4_4_ == iVar13 && auVar36._0_4_ < auVar47._0_4_ ||
                          iVar13 < auVar47._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar21 + uVar32 * 4) = 0xff7fffff;
              }
              if ((auVar47._12_4_ != auVar36._12_4_ || auVar47._8_4_ <= auVar36._8_4_) &&
                  auVar47._12_4_ <= auVar36._12_4_) {
                *(undefined4 *)((long)pvVar21 + uVar32 * 4 + 4) = 0xff7fffff;
              }
              auVar47 = (auVar51 | auVar12) ^ auVar58;
              iVar59 = auVar47._4_4_;
              if (iVar59 <= iVar13 && (iVar59 != iVar13 || auVar47._0_4_ <= auVar36._0_4_)) {
                *(undefined4 *)((long)pvVar21 + uVar32 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)pvVar21 + uVar32 * 4 + 0xc) = 0xff7fffff;
              }
              uVar32 = uVar32 + 4;
            } while ((uVar16 + 3 & 0xfffffffc) != uVar32);
          }
          if (0 < (int)uVar4) {
            sVar6 = bottom_blob->elemsize;
            sVar7 = bottom_blob->cstep;
            pvVar18 = bottom_blob->data;
            pvVar28 = top_blob->data;
            lVar31 = 0;
            do {
              if (0 < (int)uVar22) {
                uVar32 = 0;
                do {
                  fVar3 = *(float *)((long)pvVar18 + uVar32 * 4);
                  fVar48 = *(float *)((long)pvVar28 + uVar32 * 4);
                  if (fVar3 <= fVar48) {
                    fVar3 = fVar48;
                  }
                  *(float *)((long)pvVar28 + uVar32 * 4) = fVar3;
                  uVar32 = uVar32 + 1;
                } while (uVar22 != uVar32);
              }
              lVar31 = lVar31 + 1;
              pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
            } while (lVar31 != lVar15);
          }
          if ((int)uVar22 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            *(float *)((long)pvVar21 + uVar32 * 4) = *(float *)((long)pvVar21 + uVar32 * 4) * fVar2;
            uVar32 = uVar32 + 1;
          } while (uVar23 != uVar32);
          return 0;
        case -1:
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uVar32;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar32 * lVar31 + 0xf & 0xfffffffffffffff0;
          lVar26 = SUB168(auVar12 / auVar58,0);
          if (lVar26 * lVar15 == 0) {
            return -100;
          }
          local_38 = opt->workspace_allocator;
          uVar23 = lVar26 * lVar15 * uVar32 + 3 & 0xfffffffffffffffc;
          if (local_38 == (Allocator *)0x0) {
            local_40 = (void *)0x0;
            iVar13 = posix_memalign(&local_40,0x10,uVar23 + 4);
            pvVar21 = (void *)0x0;
            if (iVar13 == 0) {
              pvVar21 = local_40;
            }
          }
          else {
            iVar13 = (*local_38->_vptr_Allocator[2])(local_38,uVar23 + 4);
            pvVar21 = (void *)CONCAT44(extraout_var_08,iVar13);
          }
          *(undefined4 *)((long)pvVar21 + uVar23) = 1;
          auVar57 = _DAT_0015d310;
          auVar47 = _DAT_0015d300;
          auVar41 = _DAT_0015d1a0;
          uVar22 = SUB164(auVar12 / auVar58,0) * uVar4;
          if (0 < (int)uVar22) {
            lVar19 = (ulong)uVar22 - 1;
            auVar46._8_4_ = (int)lVar19;
            auVar46._0_8_ = lVar19;
            auVar46._12_4_ = (int)((ulong)lVar19 >> 0x20);
            uVar20 = 0;
            auVar46 = auVar46 ^ _DAT_0015d1a0;
            do {
              auVar56._8_4_ = (int)uVar20;
              auVar56._0_8_ = uVar20;
              auVar56._12_4_ = (int)(uVar20 >> 0x20);
              auVar58 = (auVar56 | auVar57) ^ auVar41;
              iVar13 = auVar46._4_4_;
              if ((bool)(~(auVar58._4_4_ == iVar13 && auVar46._0_4_ < auVar58._0_4_ ||
                          iVar13 < auVar58._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar21 + uVar20 * 4) = 0xff7fffff;
              }
              if ((auVar58._12_4_ != auVar46._12_4_ || auVar58._8_4_ <= auVar46._8_4_) &&
                  auVar58._12_4_ <= auVar46._12_4_) {
                *(undefined4 *)((long)pvVar21 + uVar20 * 4 + 4) = 0xff7fffff;
              }
              auVar58 = (auVar56 | auVar47) ^ auVar41;
              iVar59 = auVar58._4_4_;
              if (iVar59 <= iVar13 && (iVar59 != iVar13 || auVar58._0_4_ <= auVar46._0_4_)) {
                *(undefined4 *)((long)pvVar21 + uVar20 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)pvVar21 + uVar20 * 4 + 0xc) = 0xff7fffff;
              }
              uVar20 = uVar20 + 4;
            } while ((uVar22 + 3 & 0xfffffffc) != uVar20);
          }
          if (0 < (int)uVar4) {
            pvVar18 = bottom_blob->data;
            sVar6 = bottom_blob->elemsize;
            sVar7 = bottom_blob->cstep;
            lVar19 = 0;
            do {
              if (0 < (int)uVar14) {
                lVar27 = lVar26 * uVar32 * lVar19;
                pvVar28 = (void *)(sVar6 * sVar7 * lVar19 + (long)pvVar18);
                uVar20 = 0;
                do {
                  if (0 < (int)uVar16) {
                    lVar30 = 0;
                    uVar29 = (ulong)uVar16;
                    do {
                      fVar3 = *(float *)((long)pvVar28 + uVar20 * 4);
                      fVar48 = *(float *)((long)pvVar21 + lVar30 * 4 + lVar27);
                      if (fVar3 <= fVar48) {
                        fVar3 = fVar48;
                      }
                      *(float *)((long)pvVar21 + lVar30 * 4 + lVar27) = fVar3;
                      lVar30 = lVar30 + 1;
                      uVar29 = uVar29 - 1;
                    } while (uVar29 != 0);
                  }
                  pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                  uVar20 = uVar20 + 1;
                } while (uVar20 != uVar14);
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 != lVar15);
          }
          auVar41 = _DAT_0015d310;
          auVar12 = _DAT_0015d300;
          auVar58 = _DAT_0015d1a0;
          uVar14 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar14) {
            pvVar18 = top_blob->data;
            lVar31 = (ulong)uVar14 - 1;
            auVar47._8_4_ = (int)lVar31;
            auVar47._0_8_ = lVar31;
            auVar47._12_4_ = (int)((ulong)lVar31 >> 0x20);
            uVar20 = 0;
            auVar47 = auVar47 ^ _DAT_0015d1a0;
            do {
              auVar57._8_4_ = (int)uVar20;
              auVar57._0_8_ = uVar20;
              auVar57._12_4_ = (int)(uVar20 >> 0x20);
              auVar46 = (auVar57 | auVar41) ^ auVar58;
              iVar13 = auVar47._4_4_;
              if ((bool)(~(auVar46._4_4_ == iVar13 && auVar47._0_4_ < auVar46._0_4_ ||
                          iVar13 < auVar46._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar18 + uVar20 * 4) = 0xff7fffff;
              }
              if ((auVar46._12_4_ != auVar47._12_4_ || auVar46._8_4_ <= auVar47._8_4_) &&
                  auVar46._12_4_ <= auVar47._12_4_) {
                *(undefined4 *)((long)pvVar18 + uVar20 * 4 + 4) = 0xff7fffff;
              }
              auVar57 = (auVar57 | auVar12) ^ auVar58;
              iVar59 = auVar57._4_4_;
              if (iVar59 <= iVar13 && (iVar59 != iVar13 || auVar57._0_4_ <= auVar47._0_4_)) {
                *(undefined4 *)((long)pvVar18 + uVar20 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)pvVar18 + uVar20 * 4 + 0xc) = 0xff7fffff;
              }
              uVar20 = uVar20 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar20);
          }
          if (0 < (int)uVar4) {
            pvVar18 = top_blob->data;
            lVar31 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar20 = 0;
                do {
                  fVar3 = *(float *)((long)pvVar21 + uVar20 * 4 + lVar26 * uVar32 * lVar31);
                  fVar48 = *(float *)((long)pvVar18 + uVar20 * 4);
                  if (fVar3 <= fVar48) {
                    fVar3 = fVar48;
                  }
                  *(float *)((long)pvVar18 + uVar20 * 4) = fVar3;
                  uVar20 = uVar20 + 1;
                } while (uVar25 != uVar20);
              }
              lVar31 = lVar31 + 1;
            } while (lVar31 != lVar15);
          }
          if (0 < (int)uVar16) {
            pvVar18 = top_blob->data;
            uVar32 = 0;
            do {
              *(float *)((long)pvVar18 + uVar32 * 4) =
                   *(float *)((long)pvVar18 + uVar32 * 4) * fVar2;
              uVar32 = uVar32 + 1;
            } while (uVar25 != uVar32);
          }
          LOCK();
          piVar1 = (int *)((long)pvVar21 + uVar23);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 != 0) {
            return 0;
          }
          if (local_38 != (Allocator *)0x0) {
            (*local_38->_vptr_Allocator[3])(local_38,pvVar21);
            return 0;
          }
        }
        goto joined_r0x001396ae;
      }
      if (uVar4 == 0) {
        return -100;
      }
      pAVar17 = opt->workspace_allocator;
      uVar32 = uVar32 * lVar15 + 3 & 0xfffffffffffffffc;
      if (pAVar17 == (Allocator *)0x0) {
        local_40 = (void *)0x0;
        iVar13 = posix_memalign(&local_40,0x10,uVar32 + 4);
        pvVar21 = (void *)0x0;
        if (iVar13 == 0) {
          pvVar21 = local_40;
        }
      }
      else {
        iVar13 = (*pAVar17->_vptr_Allocator[2])();
        pvVar21 = (void *)CONCAT44(extraout_var_05,iVar13);
      }
      *(undefined4 *)((long)pvVar21 + uVar32) = 1;
      if ((int)uVar4 < 1) {
        auVar41._0_12_ = ZEXT812(0xff7fffff);
        auVar41._12_4_ = 0;
      }
      else {
        sVar6 = bottom_blob->elemsize;
        sVar7 = bottom_blob->cstep;
        pvVar18 = bottom_blob->data;
        lVar31 = 0;
        do {
          fVar48 = -3.4028235e+38;
          if (0 < (int)uVar22) {
            uVar25 = 0;
            fVar48 = -3.4028235e+38;
            do {
              fVar3 = *(float *)((long)pvVar18 + uVar25 * 4);
              if (fVar48 <= fVar3) {
                fVar48 = fVar3;
              }
              uVar25 = uVar25 + 1;
            } while (uVar23 != uVar25);
          }
          *(float *)((long)pvVar21 + lVar31 * 4) = fVar48;
          lVar31 = lVar31 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
        } while (lVar31 != lVar15);
        auVar41._0_12_ = ZEXT812(0xff7fffff);
        auVar41._12_4_ = 0;
        lVar31 = 0;
        do {
          fVar48 = *(float *)((long)pvVar21 + lVar31 * 4);
          if (auVar41._0_4_ <= fVar48) {
            auVar41._0_4_ = fVar48;
          }
          lVar31 = lVar31 + 1;
        } while (lVar15 != lVar31);
      }
      *(float *)top_blob->data = auVar41._0_4_ * fVar2;
      LOCK();
      piVar1 = (int *)((long)pvVar21 + uVar32);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 != 0) {
        return 0;
      }
      if (pAVar17 != (Allocator *)0x0) {
        (*pAVar17->_vptr_Allocator[3])(pAVar17,pvVar21);
        return 0;
      }
      goto LAB_001396b3;
    }
    iVar13 = this->dim;
    fVar2 = this->coeff;
    uVar16 = bottom_blob->w;
    lVar31 = (long)(int)uVar16;
    uVar25 = (ulong)uVar16;
    uVar14 = bottom_blob->h;
    uVar4 = bottom_blob->c;
    lVar15 = (long)(int)uVar4;
    uVar32 = bottom_blob->elemsize;
    if (iVar13 == 0) {
      pAVar17 = opt->blob_allocator;
      uVar22 = 1;
      goto LAB_001379dd;
    }
    switch(iVar13) {
    default:
      goto switchD_001375ef_caseD_0;
    case 1:
      pAVar17 = opt->blob_allocator;
      uVar22 = uVar4;
LAB_001379dd:
      Mat::create(top_blob,uVar22,uVar32,pAVar17);
      goto switchD_001375ef_caseD_0;
    case 2:
      pAVar17 = opt->blob_allocator;
      uVar22 = uVar4;
      uVar24 = uVar14;
      break;
    case -2:
      pAVar17 = opt->blob_allocator;
      uVar22 = uVar14;
      uVar24 = uVar16;
      break;
    case -1:
      pAVar17 = opt->blob_allocator;
      uVar22 = uVar16;
      goto LAB_001379dd;
    }
    Mat::create(top_blob,uVar24,uVar22,uVar32,pAVar17);
switchD_001375ef_caseD_0:
    auVar41 = _DAT_0015d310;
    auVar12 = _DAT_0015d300;
    auVar58 = _DAT_0015d1a0;
    pvVar21 = top_blob->data;
    if (pvVar21 == (void *)0x0) {
      return -100;
    }
    if (top_blob->cstep * (long)top_blob->c == 0) {
      return -100;
    }
    uVar22 = uVar14 * uVar16;
    uVar23 = (ulong)uVar22;
    if (iVar13 != 0) {
      switch(iVar13) {
      default:
        goto switchD_00137f5a_caseD_0;
      case 1:
        if ((int)uVar4 < 1) {
          return 0;
        }
        sVar6 = bottom_blob->elemsize;
        sVar7 = bottom_blob->cstep;
        pvVar18 = bottom_blob->data;
        lVar31 = 0;
        do {
          fVar48 = 3.4028235e+38;
          if (0 < (int)uVar22) {
            uVar32 = 0;
            fVar48 = 3.4028235e+38;
            do {
              fVar3 = *(float *)((long)pvVar18 + uVar32 * 4);
              if (fVar3 <= fVar48) {
                fVar48 = fVar3;
              }
              uVar32 = uVar32 + 1;
            } while (uVar23 != uVar32);
          }
          *(float *)((long)pvVar21 + lVar31 * 4) = fVar48 * fVar2;
          lVar31 = lVar31 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
        } while (lVar31 != lVar15);
        return 0;
      case 2:
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar18 = bottom_blob->data;
        sVar6 = bottom_blob->elemsize;
        iVar13 = top_blob->w;
        sVar7 = top_blob->elemsize;
        sVar5 = bottom_blob->cstep;
        lVar26 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar32 = 0;
            pvVar28 = pvVar18;
            do {
              fVar48 = 3.4028235e+38;
              if (0 < (int)uVar16) {
                uVar23 = 0;
                fVar48 = 3.4028235e+38;
                do {
                  fVar3 = *(float *)((long)pvVar28 + uVar23 * 4);
                  if (fVar3 <= fVar48) {
                    fVar48 = fVar3;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar25 != uVar23);
              }
              *(float *)((long)pvVar21 + uVar32 * 4 + (long)iVar13 * sVar7 * lVar26) =
                   fVar48 * fVar2;
              uVar32 = uVar32 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
            } while (uVar32 != uVar14);
          }
          lVar26 = lVar26 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar5);
        } while (lVar26 != lVar15);
        return 0;
      case -2:
        uVar16 = (int)top_blob->cstep * top_blob->c;
        if (0 < (int)uVar16) {
          lVar31 = (ulong)uVar16 - 1;
          auVar34._8_4_ = (int)lVar31;
          auVar34._0_8_ = lVar31;
          auVar34._12_4_ = (int)((ulong)lVar31 >> 0x20);
          uVar32 = 0;
          auVar34 = auVar34 ^ _DAT_0015d1a0;
          do {
            auVar49._8_4_ = (int)uVar32;
            auVar49._0_8_ = uVar32;
            auVar49._12_4_ = (int)(uVar32 >> 0x20);
            auVar47 = (auVar49 | auVar41) ^ auVar58;
            iVar13 = auVar34._4_4_;
            if ((bool)(~(auVar47._4_4_ == iVar13 && auVar34._0_4_ < auVar47._0_4_ ||
                        iVar13 < auVar47._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar21 + uVar32 * 4) = 0x7f7fffff;
            }
            if ((auVar47._12_4_ != auVar34._12_4_ || auVar47._8_4_ <= auVar34._8_4_) &&
                auVar47._12_4_ <= auVar34._12_4_) {
              *(undefined4 *)((long)pvVar21 + uVar32 * 4 + 4) = 0x7f7fffff;
            }
            auVar47 = (auVar49 | auVar12) ^ auVar58;
            iVar59 = auVar47._4_4_;
            if (iVar59 <= iVar13 && (iVar59 != iVar13 || auVar47._0_4_ <= auVar34._0_4_)) {
              *(undefined4 *)((long)pvVar21 + uVar32 * 4 + 8) = 0x7f7fffff;
              *(undefined4 *)((long)pvVar21 + uVar32 * 4 + 0xc) = 0x7f7fffff;
            }
            uVar32 = uVar32 + 4;
          } while ((uVar16 + 3 & 0xfffffffc) != uVar32);
        }
        if (0 < (int)uVar4) {
          sVar6 = bottom_blob->elemsize;
          sVar7 = bottom_blob->cstep;
          pvVar18 = bottom_blob->data;
          pvVar28 = top_blob->data;
          lVar31 = 0;
          do {
            if (0 < (int)uVar22) {
              uVar32 = 0;
              do {
                fVar3 = *(float *)((long)pvVar18 + uVar32 * 4);
                fVar48 = *(float *)((long)pvVar28 + uVar32 * 4);
                if (fVar48 <= fVar3) {
                  fVar3 = fVar48;
                }
                *(float *)((long)pvVar28 + uVar32 * 4) = fVar3;
                uVar32 = uVar32 + 1;
              } while (uVar22 != uVar32);
            }
            lVar31 = lVar31 + 1;
            pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
          } while (lVar31 != lVar15);
        }
        if ((int)uVar22 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          *(float *)((long)pvVar21 + uVar32 * 4) = *(float *)((long)pvVar21 + uVar32 * 4) * fVar2;
          uVar32 = uVar32 + 1;
        } while (uVar23 != uVar32);
        return 0;
      case -1:
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar32;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar32 * lVar31 + 0xf & 0xfffffffffffffff0;
        lVar26 = SUB168(auVar10 / auVar8,0);
        if (lVar26 * lVar15 == 0) {
          return -100;
        }
        local_38 = opt->workspace_allocator;
        uVar23 = lVar26 * lVar15 * uVar32 + 3 & 0xfffffffffffffffc;
        if (local_38 == (Allocator *)0x0) {
          local_40 = (void *)0x0;
          iVar13 = posix_memalign(&local_40,0x10,uVar23 + 4);
          pvVar21 = (void *)0x0;
          if (iVar13 == 0) {
            pvVar21 = local_40;
          }
        }
        else {
          iVar13 = (*local_38->_vptr_Allocator[2])(local_38,uVar23 + 4);
          pvVar21 = (void *)CONCAT44(extraout_var_06,iVar13);
        }
        *(undefined4 *)((long)pvVar21 + uVar23) = 1;
        auVar41 = _DAT_0015d310;
        auVar12 = _DAT_0015d300;
        auVar58 = _DAT_0015d1a0;
        uVar22 = SUB164(auVar10 / auVar8,0) * uVar4;
        if (0 < (int)uVar22) {
          lVar19 = (ulong)uVar22 - 1;
          auVar42._8_4_ = (int)lVar19;
          auVar42._0_8_ = lVar19;
          auVar42._12_4_ = (int)((ulong)lVar19 >> 0x20);
          uVar20 = 0;
          auVar42 = auVar42 ^ _DAT_0015d1a0;
          do {
            auVar52._8_4_ = (int)uVar20;
            auVar52._0_8_ = uVar20;
            auVar52._12_4_ = (int)(uVar20 >> 0x20);
            auVar47 = (auVar52 | auVar41) ^ auVar58;
            iVar13 = auVar42._4_4_;
            if ((bool)(~(auVar47._4_4_ == iVar13 && auVar42._0_4_ < auVar47._0_4_ ||
                        iVar13 < auVar47._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar21 + uVar20 * 4) = 0x7f7fffff;
            }
            if ((auVar47._12_4_ != auVar42._12_4_ || auVar47._8_4_ <= auVar42._8_4_) &&
                auVar47._12_4_ <= auVar42._12_4_) {
              *(undefined4 *)((long)pvVar21 + uVar20 * 4 + 4) = 0x7f7fffff;
            }
            auVar47 = (auVar52 | auVar12) ^ auVar58;
            iVar59 = auVar47._4_4_;
            if (iVar59 <= iVar13 && (iVar59 != iVar13 || auVar47._0_4_ <= auVar42._0_4_)) {
              *(undefined4 *)((long)pvVar21 + uVar20 * 4 + 8) = 0x7f7fffff;
              *(undefined4 *)((long)pvVar21 + uVar20 * 4 + 0xc) = 0x7f7fffff;
            }
            uVar20 = uVar20 + 4;
          } while ((uVar22 + 3 & 0xfffffffc) != uVar20);
        }
        if (0 < (int)uVar4) {
          pvVar18 = bottom_blob->data;
          sVar6 = bottom_blob->elemsize;
          sVar7 = bottom_blob->cstep;
          lVar19 = 0;
          do {
            if (0 < (int)uVar14) {
              lVar27 = lVar26 * uVar32 * lVar19;
              pvVar28 = (void *)(sVar6 * sVar7 * lVar19 + (long)pvVar18);
              uVar20 = 0;
              do {
                if (0 < (int)uVar16) {
                  lVar30 = 0;
                  uVar29 = (ulong)uVar16;
                  do {
                    fVar3 = *(float *)((long)pvVar28 + uVar20 * 4);
                    fVar48 = *(float *)((long)pvVar21 + lVar30 * 4 + lVar27);
                    if (fVar48 <= fVar3) {
                      fVar3 = fVar48;
                    }
                    *(float *)((long)pvVar21 + lVar30 * 4 + lVar27) = fVar3;
                    lVar30 = lVar30 + 1;
                    uVar29 = uVar29 - 1;
                  } while (uVar29 != 0);
                }
                pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar14);
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != lVar15);
        }
        auVar41 = _DAT_0015d310;
        auVar12 = _DAT_0015d300;
        auVar58 = _DAT_0015d1a0;
        uVar14 = top_blob->c * (int)top_blob->cstep;
        if (0 < (int)uVar14) {
          pvVar18 = top_blob->data;
          lVar31 = (ulong)uVar14 - 1;
          auVar43._8_4_ = (int)lVar31;
          auVar43._0_8_ = lVar31;
          auVar43._12_4_ = (int)((ulong)lVar31 >> 0x20);
          uVar20 = 0;
          auVar43 = auVar43 ^ _DAT_0015d1a0;
          do {
            auVar53._8_4_ = (int)uVar20;
            auVar53._0_8_ = uVar20;
            auVar53._12_4_ = (int)(uVar20 >> 0x20);
            auVar47 = (auVar53 | auVar41) ^ auVar58;
            iVar13 = auVar43._4_4_;
            if ((bool)(~(auVar47._4_4_ == iVar13 && auVar43._0_4_ < auVar47._0_4_ ||
                        iVar13 < auVar47._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar18 + uVar20 * 4) = 0x7f7fffff;
            }
            if ((auVar47._12_4_ != auVar43._12_4_ || auVar47._8_4_ <= auVar43._8_4_) &&
                auVar47._12_4_ <= auVar43._12_4_) {
              *(undefined4 *)((long)pvVar18 + uVar20 * 4 + 4) = 0x7f7fffff;
            }
            auVar47 = (auVar53 | auVar12) ^ auVar58;
            iVar59 = auVar47._4_4_;
            if (iVar59 <= iVar13 && (iVar59 != iVar13 || auVar47._0_4_ <= auVar43._0_4_)) {
              *(undefined4 *)((long)pvVar18 + uVar20 * 4 + 8) = 0x7f7fffff;
              *(undefined4 *)((long)pvVar18 + uVar20 * 4 + 0xc) = 0x7f7fffff;
            }
            uVar20 = uVar20 + 4;
          } while ((uVar14 + 3 & 0xfffffffc) != uVar20);
        }
        if (0 < (int)uVar4) {
          pvVar18 = top_blob->data;
          lVar31 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar20 = 0;
              do {
                fVar3 = *(float *)((long)pvVar21 + uVar20 * 4 + lVar26 * uVar32 * lVar31);
                fVar48 = *(float *)((long)pvVar18 + uVar20 * 4);
                if (fVar48 <= fVar3) {
                  fVar3 = fVar48;
                }
                *(float *)((long)pvVar18 + uVar20 * 4) = fVar3;
                uVar20 = uVar20 + 1;
              } while (uVar25 != uVar20);
            }
            lVar31 = lVar31 + 1;
          } while (lVar31 != lVar15);
        }
        if (0 < (int)uVar16) {
          pvVar18 = top_blob->data;
          uVar32 = 0;
          do {
            *(float *)((long)pvVar18 + uVar32 * 4) = *(float *)((long)pvVar18 + uVar32 * 4) * fVar2;
            uVar32 = uVar32 + 1;
          } while (uVar25 != uVar32);
        }
        LOCK();
        piVar1 = (int *)((long)pvVar21 + uVar23);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 != 0) {
          return 0;
        }
        if (local_38 != (Allocator *)0x0) {
          (*local_38->_vptr_Allocator[3])(local_38,pvVar21);
          return 0;
        }
      }
      goto joined_r0x001396ae;
    }
    if (uVar4 == 0) {
      return -100;
    }
    pAVar17 = opt->workspace_allocator;
    uVar32 = uVar32 * lVar15 + 3 & 0xfffffffffffffffc;
    if (pAVar17 == (Allocator *)0x0) {
      local_40 = (void *)0x0;
      iVar13 = posix_memalign(&local_40,0x10,uVar32 + 4);
      pvVar21 = (void *)0x0;
      if (iVar13 == 0) {
        pvVar21 = local_40;
      }
    }
    else {
      iVar13 = (*pAVar17->_vptr_Allocator[2])();
      pvVar21 = (void *)CONCAT44(extraout_var_03,iVar13);
    }
    *(undefined4 *)((long)pvVar21 + uVar32) = 1;
    if ((int)uVar4 < 1) {
      auVar39._0_12_ = ZEXT812(0x7f7fffff);
      auVar39._12_4_ = 0;
    }
    else {
      sVar6 = bottom_blob->elemsize;
      sVar7 = bottom_blob->cstep;
      pvVar18 = bottom_blob->data;
      lVar31 = 0;
      do {
        fVar48 = 3.4028235e+38;
        if (0 < (int)uVar22) {
          uVar25 = 0;
          fVar48 = 3.4028235e+38;
          do {
            fVar3 = *(float *)((long)pvVar18 + uVar25 * 4);
            if (fVar3 <= fVar48) {
              fVar48 = fVar3;
            }
            uVar25 = uVar25 + 1;
          } while (uVar23 != uVar25);
        }
        *(float *)((long)pvVar21 + lVar31 * 4) = fVar48;
        lVar31 = lVar31 + 1;
        pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
      } while (lVar31 != lVar15);
      auVar39._0_12_ = ZEXT812(0x7f7fffff);
      auVar39._12_4_ = 0;
      lVar31 = 0;
      do {
        fVar48 = *(float *)((long)pvVar21 + lVar31 * 4);
        if (fVar48 <= auVar39._0_4_) {
          auVar39._0_4_ = fVar48;
        }
        lVar31 = lVar31 + 1;
      } while (lVar15 != lVar31);
    }
    *(float *)top_blob->data = auVar39._0_4_ * fVar2;
    LOCK();
    piVar1 = (int *)((long)pvVar21 + uVar32);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return 0;
    }
    if (pAVar17 != (Allocator *)0x0) {
      (*pAVar17->_vptr_Allocator[3])(pAVar17,pvVar21);
      return 0;
    }
    goto LAB_001396b3;
  }
  iVar13 = this->dim;
  fVar2 = this->coeff;
  uVar16 = bottom_blob->w;
  lVar31 = (long)(int)uVar16;
  uVar25 = (ulong)uVar16;
  uVar14 = bottom_blob->h;
  uVar4 = bottom_blob->c;
  lVar15 = (long)(int)uVar4;
  uVar32 = bottom_blob->elemsize;
  if (iVar13 == 0) {
    pAVar17 = opt->blob_allocator;
    uVar22 = 1;
    goto LAB_001379fb;
  }
  switch(iVar13) {
  default:
    goto switchD_0013765b_caseD_0;
  case 1:
    pAVar17 = opt->blob_allocator;
    uVar22 = uVar4;
LAB_001379fb:
    Mat::create(top_blob,uVar22,uVar32,pAVar17);
    goto switchD_0013765b_caseD_0;
  case 2:
    pAVar17 = opt->blob_allocator;
    uVar22 = uVar4;
    uVar24 = uVar14;
    break;
  case -2:
    pAVar17 = opt->blob_allocator;
    uVar22 = uVar14;
    uVar24 = uVar16;
    break;
  case -1:
    pAVar17 = opt->blob_allocator;
    uVar22 = uVar16;
    goto LAB_001379fb;
  }
  Mat::create(top_blob,uVar24,uVar22,uVar32,pAVar17);
switchD_0013765b_caseD_0:
  auVar41 = _DAT_0015d310;
  auVar12 = _DAT_0015d300;
  auVar58 = _DAT_0015d1a0;
  pvVar21 = top_blob->data;
  if (pvVar21 == (void *)0x0) {
    return -100;
  }
  if (top_blob->cstep * (long)top_blob->c == 0) {
    return -100;
  }
  uVar22 = uVar14 * uVar16;
  uVar23 = (ulong)uVar22;
  if (iVar13 != 0) {
    switch(iVar13) {
    default:
      goto switchD_00137f5a_caseD_0;
    case 1:
      if (0 < (int)uVar4) {
        sVar6 = bottom_blob->elemsize;
        sVar7 = bottom_blob->cstep;
        pvVar18 = bottom_blob->data;
        lVar31 = 0;
        do {
          fVar48 = 1.0;
          if (0 < (int)uVar22) {
            uVar32 = 0;
            fVar48 = 1.0;
            do {
              fVar48 = fVar48 * *(float *)((long)pvVar18 + uVar32 * 4);
              uVar32 = uVar32 + 1;
            } while (uVar23 != uVar32);
          }
          *(float *)((long)pvVar21 + lVar31 * 4) = fVar48 * fVar2;
          lVar31 = lVar31 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
        } while (lVar31 != lVar15);
        return 0;
      }
      return 0;
    case 2:
      if (0 < (int)uVar4) {
        pvVar18 = bottom_blob->data;
        sVar6 = bottom_blob->elemsize;
        iVar13 = top_blob->w;
        sVar7 = top_blob->elemsize;
        sVar5 = bottom_blob->cstep;
        lVar26 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar32 = 0;
            pvVar28 = pvVar18;
            do {
              fVar48 = 1.0;
              if (0 < (int)uVar16) {
                uVar23 = 0;
                fVar48 = 1.0;
                do {
                  fVar48 = fVar48 * *(float *)((long)pvVar28 + uVar23 * 4);
                  uVar23 = uVar23 + 1;
                } while (uVar25 != uVar23);
              }
              *(float *)((long)pvVar21 + uVar32 * 4 + (long)iVar13 * sVar7 * lVar26) =
                   fVar48 * fVar2;
              uVar32 = uVar32 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
            } while (uVar32 != uVar14);
          }
          lVar26 = lVar26 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar5);
        } while (lVar26 != lVar15);
        return 0;
      }
      return 0;
    case -2:
      uVar16 = (int)top_blob->cstep * top_blob->c;
      if (0 < (int)uVar16) {
        lVar31 = (ulong)uVar16 - 1;
        auVar35._8_4_ = (int)lVar31;
        auVar35._0_8_ = lVar31;
        auVar35._12_4_ = (int)((ulong)lVar31 >> 0x20);
        uVar32 = 0;
        auVar35 = auVar35 ^ _DAT_0015d1a0;
        do {
          auVar50._8_4_ = (int)uVar32;
          auVar50._0_8_ = uVar32;
          auVar50._12_4_ = (int)(uVar32 >> 0x20);
          auVar47 = (auVar50 | auVar41) ^ auVar58;
          iVar13 = auVar35._4_4_;
          if ((bool)(~(auVar47._4_4_ == iVar13 && auVar35._0_4_ < auVar47._0_4_ ||
                      iVar13 < auVar47._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar21 + uVar32 * 4) = 0x3f800000;
          }
          if ((auVar47._12_4_ != auVar35._12_4_ || auVar47._8_4_ <= auVar35._8_4_) &&
              auVar47._12_4_ <= auVar35._12_4_) {
            *(undefined4 *)((long)pvVar21 + uVar32 * 4 + 4) = 0x3f800000;
          }
          auVar47 = (auVar50 | auVar12) ^ auVar58;
          iVar59 = auVar47._4_4_;
          if (iVar59 <= iVar13 && (iVar59 != iVar13 || auVar47._0_4_ <= auVar35._0_4_)) {
            *(undefined4 *)((long)pvVar21 + uVar32 * 4 + 8) = 0x3f800000;
            *(undefined4 *)((long)pvVar21 + uVar32 * 4 + 0xc) = 0x3f800000;
          }
          uVar32 = uVar32 + 4;
        } while ((uVar16 + 3 & 0xfffffffc) != uVar32);
      }
      if (0 < (int)uVar4) {
        sVar6 = bottom_blob->elemsize;
        sVar7 = bottom_blob->cstep;
        pvVar18 = bottom_blob->data;
        pvVar28 = top_blob->data;
        lVar31 = 0;
        do {
          if (0 < (int)uVar22) {
            uVar32 = 0;
            do {
              *(float *)((long)pvVar28 + uVar32 * 4) =
                   *(float *)((long)pvVar18 + uVar32 * 4) * *(float *)((long)pvVar28 + uVar32 * 4);
              uVar32 = uVar32 + 1;
            } while (uVar22 != uVar32);
          }
          lVar31 = lVar31 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
        } while (lVar31 != lVar15);
      }
      if (0 < (int)uVar22) {
        uVar32 = 0;
        do {
          *(float *)((long)pvVar21 + uVar32 * 4) = *(float *)((long)pvVar21 + uVar32 * 4) * fVar2;
          uVar32 = uVar32 + 1;
        } while (uVar23 != uVar32);
        return 0;
      }
      return 0;
    case -1:
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar32;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar32 * lVar31 + 0xf & 0xfffffffffffffff0;
      lVar26 = SUB168(auVar11 / auVar9,0);
      if (lVar26 * lVar15 == 0) {
        return -100;
      }
      local_38 = opt->workspace_allocator;
      uVar23 = lVar26 * lVar15 * uVar32 + 3 & 0xfffffffffffffffc;
      if (local_38 == (Allocator *)0x0) {
        local_40 = (void *)0x0;
        iVar13 = posix_memalign(&local_40,0x10,uVar23 + 4);
        pvVar21 = (void *)0x0;
        if (iVar13 == 0) {
          pvVar21 = local_40;
        }
      }
      else {
        iVar13 = (*local_38->_vptr_Allocator[2])(local_38,uVar23 + 4);
        pvVar21 = (void *)CONCAT44(extraout_var_07,iVar13);
      }
      *(undefined4 *)((long)pvVar21 + uVar23) = 1;
      auVar41 = _DAT_0015d310;
      auVar12 = _DAT_0015d300;
      auVar58 = _DAT_0015d1a0;
      uVar22 = SUB164(auVar11 / auVar9,0) * uVar4;
      if (0 < (int)uVar22) {
        lVar19 = (ulong)uVar22 - 1;
        auVar44._8_4_ = (int)lVar19;
        auVar44._0_8_ = lVar19;
        auVar44._12_4_ = (int)((ulong)lVar19 >> 0x20);
        uVar20 = 0;
        auVar44 = auVar44 ^ _DAT_0015d1a0;
        do {
          auVar54._8_4_ = (int)uVar20;
          auVar54._0_8_ = uVar20;
          auVar54._12_4_ = (int)(uVar20 >> 0x20);
          auVar47 = (auVar54 | auVar41) ^ auVar58;
          iVar13 = auVar44._4_4_;
          if ((bool)(~(auVar47._4_4_ == iVar13 && auVar44._0_4_ < auVar47._0_4_ ||
                      iVar13 < auVar47._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar21 + uVar20 * 4) = 0x3f800000;
          }
          if ((auVar47._12_4_ != auVar44._12_4_ || auVar47._8_4_ <= auVar44._8_4_) &&
              auVar47._12_4_ <= auVar44._12_4_) {
            *(undefined4 *)((long)pvVar21 + uVar20 * 4 + 4) = 0x3f800000;
          }
          auVar47 = (auVar54 | auVar12) ^ auVar58;
          iVar59 = auVar47._4_4_;
          if (iVar59 <= iVar13 && (iVar59 != iVar13 || auVar47._0_4_ <= auVar44._0_4_)) {
            *(undefined4 *)((long)pvVar21 + uVar20 * 4 + 8) = 0x3f800000;
            *(undefined4 *)((long)pvVar21 + uVar20 * 4 + 0xc) = 0x3f800000;
          }
          uVar20 = uVar20 + 4;
        } while ((uVar22 + 3 & 0xfffffffc) != uVar20);
      }
      if (0 < (int)uVar4) {
        pvVar18 = bottom_blob->data;
        sVar6 = bottom_blob->elemsize;
        sVar7 = bottom_blob->cstep;
        lVar19 = 0;
        do {
          if (0 < (int)uVar14) {
            lVar27 = lVar26 * uVar32 * lVar19;
            pvVar28 = (void *)(sVar6 * sVar7 * lVar19 + (long)pvVar18);
            uVar20 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar30 = 0;
                uVar29 = (ulong)uVar16;
                do {
                  *(float *)((long)pvVar21 + lVar30 * 4 + lVar27) =
                       *(float *)((long)pvVar28 + uVar20 * 4) *
                       *(float *)((long)pvVar21 + lVar30 * 4 + lVar27);
                  lVar30 = lVar30 + 1;
                  uVar29 = uVar29 - 1;
                } while (uVar29 != 0);
              }
              pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar20 != uVar14);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != lVar15);
      }
      auVar41 = _DAT_0015d310;
      auVar12 = _DAT_0015d300;
      auVar58 = _DAT_0015d1a0;
      uVar14 = top_blob->c * (int)top_blob->cstep;
      if (0 < (int)uVar14) {
        pvVar18 = top_blob->data;
        lVar31 = (ulong)uVar14 - 1;
        auVar45._8_4_ = (int)lVar31;
        auVar45._0_8_ = lVar31;
        auVar45._12_4_ = (int)((ulong)lVar31 >> 0x20);
        uVar20 = 0;
        auVar45 = auVar45 ^ _DAT_0015d1a0;
        do {
          auVar55._8_4_ = (int)uVar20;
          auVar55._0_8_ = uVar20;
          auVar55._12_4_ = (int)(uVar20 >> 0x20);
          auVar47 = (auVar55 | auVar41) ^ auVar58;
          iVar13 = auVar45._4_4_;
          if ((bool)(~(auVar47._4_4_ == iVar13 && auVar45._0_4_ < auVar47._0_4_ ||
                      iVar13 < auVar47._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar18 + uVar20 * 4) = 0x3f800000;
          }
          if ((auVar47._12_4_ != auVar45._12_4_ || auVar47._8_4_ <= auVar45._8_4_) &&
              auVar47._12_4_ <= auVar45._12_4_) {
            *(undefined4 *)((long)pvVar18 + uVar20 * 4 + 4) = 0x3f800000;
          }
          auVar47 = (auVar55 | auVar12) ^ auVar58;
          iVar59 = auVar47._4_4_;
          if (iVar59 <= iVar13 && (iVar59 != iVar13 || auVar47._0_4_ <= auVar45._0_4_)) {
            *(undefined4 *)((long)pvVar18 + uVar20 * 4 + 8) = 0x3f800000;
            *(undefined4 *)((long)pvVar18 + uVar20 * 4 + 0xc) = 0x3f800000;
          }
          uVar20 = uVar20 + 4;
        } while ((uVar14 + 3 & 0xfffffffc) != uVar20);
      }
      if (0 < (int)uVar4) {
        pvVar18 = top_blob->data;
        lVar31 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar20 = 0;
            do {
              *(float *)((long)pvVar18 + uVar20 * 4) =
                   *(float *)((long)pvVar21 + uVar20 * 4 + lVar26 * uVar32 * lVar31) *
                   *(float *)((long)pvVar18 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar25 != uVar20);
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != lVar15);
      }
      if (0 < (int)uVar16) {
        pvVar18 = top_blob->data;
        uVar32 = 0;
        do {
          *(float *)((long)pvVar18 + uVar32 * 4) = *(float *)((long)pvVar18 + uVar32 * 4) * fVar2;
          uVar32 = uVar32 + 1;
        } while (uVar25 != uVar32);
      }
      LOCK();
      piVar1 = (int *)((long)pvVar21 + uVar23);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 != 0) {
        return 0;
      }
      if (local_38 != (Allocator *)0x0) {
        (*local_38->_vptr_Allocator[3])(local_38,pvVar21);
        return 0;
      }
    }
    goto joined_r0x001396ae;
  }
  if (uVar4 == 0) {
    return -100;
  }
  pAVar17 = opt->workspace_allocator;
  uVar32 = uVar32 * lVar15 + 3 & 0xfffffffffffffffc;
  if (pAVar17 == (Allocator *)0x0) {
    local_40 = (void *)0x0;
    iVar13 = posix_memalign(&local_40,0x10,uVar32 + 4);
    pvVar21 = (void *)0x0;
    if (iVar13 == 0) {
      pvVar21 = local_40;
    }
  }
  else {
    iVar13 = (*pAVar17->_vptr_Allocator[2])();
    pvVar21 = (void *)CONCAT44(extraout_var_04,iVar13);
  }
  *(undefined4 *)((long)pvVar21 + uVar32) = 1;
  if ((int)uVar4 < 1) {
    auVar40._0_12_ = ZEXT812(0x3f800000);
    auVar40._12_4_ = 0;
  }
  else {
    sVar6 = bottom_blob->elemsize;
    sVar7 = bottom_blob->cstep;
    pvVar18 = bottom_blob->data;
    lVar31 = 0;
    do {
      fVar48 = 1.0;
      if (0 < (int)uVar22) {
        uVar25 = 0;
        fVar48 = 1.0;
        do {
          fVar48 = fVar48 * *(float *)((long)pvVar18 + uVar25 * 4);
          uVar25 = uVar25 + 1;
        } while (uVar23 != uVar25);
      }
      *(float *)((long)pvVar21 + lVar31 * 4) = fVar48;
      lVar31 = lVar31 + 1;
      pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
    } while (lVar31 != lVar15);
    auVar40._0_12_ = ZEXT812(0x3f800000);
    auVar40._12_4_ = 0;
    lVar31 = 0;
    do {
      auVar40._0_4_ = auVar40._0_4_ * *(float *)((long)pvVar21 + lVar31 * 4);
      lVar31 = lVar31 + 1;
    } while (lVar15 != lVar31);
  }
  *(float *)top_blob->data = auVar40._0_4_ * fVar2;
  LOCK();
  piVar1 = (int *)((long)pvVar21 + uVar32);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 != 0) {
    return 0;
  }
  if (pAVar17 != (Allocator *)0x0) {
    (*pAVar17->_vptr_Allocator[3])(pAVar17,pvVar21);
    return 0;
  }
  goto LAB_001396b3;
switchD_0013718a_caseD_ffffffff:
  uVar25 = (sVar6 * lVar31 + 0xf & 0xfffffffffffffff0) / sVar6;
  if (uVar25 * lVar15 == 0) {
    return -100;
  }
  local_38 = opt->workspace_allocator;
  uVar23 = uVar25 * lVar15 * sVar6 + 3 & 0xfffffffffffffffc;
  if (local_38 == (Allocator *)0x0) {
    local_40 = (void *)0x0;
    iVar13 = posix_memalign(&local_40,0x10,uVar23 + 4);
    pvVar21 = (void *)0x0;
    if (iVar13 == 0) {
      pvVar21 = local_40;
    }
  }
  else {
    iVar13 = (*local_38->_vptr_Allocator[2])();
    pvVar21 = (void *)CONCAT44(extraout_var_01,iVar13);
  }
  *(undefined4 *)((long)pvVar21 + uVar23) = 1;
  uVar22 = (int)uVar25 * uVar4;
  if (0 < (int)uVar22) {
    memset(pvVar21,0,(ulong)uVar22 << 2);
  }
  if (0 < (int)uVar4) {
    pvVar18 = bottom_blob->data;
    sVar7 = bottom_blob->elemsize;
    sVar5 = bottom_blob->cstep;
    lVar26 = 0;
    do {
      if (0 < (int)uVar14) {
        lVar19 = uVar25 * sVar6 * lVar26;
        pvVar28 = (void *)(sVar7 * sVar5 * lVar26 + (long)pvVar18);
        uVar20 = 0;
        do {
          if (0 < (int)uVar16) {
            lVar27 = 0;
            uVar29 = (ulong)uVar16;
            do {
              fVar48 = *(float *)((long)pvVar28 + uVar20 * 4);
              *(float *)((long)pvVar21 + lVar27 * 4 + lVar19) =
                   fVar48 * fVar48 + *(float *)((long)pvVar21 + lVar27 * 4 + lVar19);
              lVar27 = lVar27 + 1;
              uVar29 = uVar29 - 1;
            } while (uVar29 != 0);
          }
          pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar14);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != lVar15);
  }
  uVar14 = top_blob->c * (int)top_blob->cstep;
  if (0 < (int)uVar14) {
    memset(top_blob->data,0,(ulong)uVar14 << 2);
  }
  if (0 < (int)uVar4) {
    pvVar18 = top_blob->data;
    lVar31 = 0;
    do {
      if (0 < (int)uVar16) {
        uVar20 = 0;
        do {
          *(float *)((long)pvVar18 + uVar20 * 4) =
               *(float *)((long)pvVar21 + uVar20 * 4 + uVar25 * sVar6 * lVar31) +
               *(float *)((long)pvVar18 + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar32 != uVar20);
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 != lVar15);
  }
  if (0 < (int)uVar16) {
    pvVar18 = top_blob->data;
    uVar25 = 0;
    do {
      *(float *)((long)pvVar18 + uVar25 * 4) = *(float *)((long)pvVar18 + uVar25 * 4) * fVar2;
      uVar25 = uVar25 + 1;
    } while (uVar32 != uVar25);
  }
  LOCK();
  piVar1 = (int *)((long)pvVar21 + uVar23);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 != 0) {
    return 0;
  }
  if (local_38 != (Allocator *)0x0) {
    (*local_38->_vptr_Allocator[3])(local_38,pvVar21);
    return 0;
  }
  goto joined_r0x001396ae;
switchD_00137334_caseD_ffffffff:
  uVar25 = (sVar6 * lVar31 + 0xf & 0xfffffffffffffff0) / sVar6;
  if (uVar25 * lVar15 == 0) {
    return -100;
  }
  local_38 = opt->workspace_allocator;
  uVar23 = uVar25 * lVar15 * sVar6 + 3 & 0xfffffffffffffffc;
  if (local_38 == (Allocator *)0x0) {
    local_40 = (void *)0x0;
    iVar13 = posix_memalign(&local_40,0x10,uVar23 + 4);
    pvVar21 = (void *)0x0;
    if (iVar13 == 0) {
      pvVar21 = local_40;
    }
  }
  else {
    iVar13 = (*local_38->_vptr_Allocator[2])();
    pvVar21 = (void *)CONCAT44(extraout_var_02,iVar13);
  }
  *(undefined4 *)((long)pvVar21 + uVar23) = 1;
  uVar22 = (int)uVar25 * uVar4;
  if (0 < (int)uVar22) {
    memset(pvVar21,0,(ulong)uVar22 << 2);
  }
  if (0 < (int)uVar4) {
    pvVar18 = bottom_blob->data;
    sVar7 = bottom_blob->elemsize;
    sVar5 = bottom_blob->cstep;
    lVar26 = 0;
    do {
      if (0 < (int)uVar14) {
        lVar19 = uVar25 * sVar6 * lVar26;
        pvVar28 = (void *)(sVar7 * sVar5 * lVar26 + (long)pvVar18);
        uVar20 = 0;
        do {
          if (0 < (int)uVar16) {
            lVar27 = 0;
            uVar29 = (ulong)uVar16;
            do {
              *(float *)((long)pvVar21 + lVar27 * 4 + lVar19) =
                   ABS(*(float *)((long)pvVar28 + uVar20 * 4)) +
                   *(float *)((long)pvVar21 + lVar27 * 4 + lVar19);
              lVar27 = lVar27 + 1;
              uVar29 = uVar29 - 1;
            } while (uVar29 != 0);
          }
          pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar14);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != lVar15);
  }
  uVar14 = top_blob->c * (int)top_blob->cstep;
  if (0 < (int)uVar14) {
    memset(top_blob->data,0,(ulong)uVar14 << 2);
  }
  if (0 < (int)uVar4) {
    pvVar18 = top_blob->data;
    lVar31 = 0;
    do {
      if (0 < (int)uVar16) {
        uVar20 = 0;
        do {
          *(float *)((long)pvVar18 + uVar20 * 4) =
               *(float *)((long)pvVar21 + uVar20 * 4 + uVar25 * sVar6 * lVar31) +
               *(float *)((long)pvVar18 + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar32 != uVar20);
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 != lVar15);
  }
  if (0 < (int)uVar16) {
    pvVar18 = top_blob->data;
    uVar25 = 0;
    do {
      *(float *)((long)pvVar18 + uVar25 * 4) = *(float *)((long)pvVar18 + uVar25 * 4) * fVar2;
      uVar25 = uVar25 + 1;
    } while (uVar32 != uVar25);
  }
  LOCK();
  piVar1 = (int *)((long)pvVar21 + uVar23);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 != 0) {
    return 0;
  }
  if (local_38 != (Allocator *)0x0) {
    (*local_38->_vptr_Allocator[3])(local_38,pvVar21);
    return 0;
  }
joined_r0x001396ae:
  if (pvVar21 == (void *)0x0) {
    return 0;
  }
LAB_001396b3:
  free(pvVar21);
switchD_00137f5a_caseD_0:
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (operation == ReductionOp_SUM)
        return reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);

    if (operation == ReductionOp_ASUM)
        return reduction_op< reduction_op_asum<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction_op< reduction_op_sumsq<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);

    if (operation == ReductionOp_MEAN)
    {
        int ret = reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);
        if (ret != 0)
            return -100;

        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        if (dim == 0)
        {
            top_blob[0] /= channels * size;
        }
        else if (dim == 1)
        {
            for (int q=0; q<channels; q++)
            {
                top_blob[q] /= size;
            }
        }
        else if (dim == 2)
        {
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<h; i++)
                {
                    outptr[i] /= w;
                }
            }
        }
        else if (dim == -1)
        {
            for (int j=0; j<w; j++)
            {
                top_blob[j] /= h * channels;
            }
        }
        else if (dim == -2)
        {
            for (int i=0; i<size; i++)
            {
                top_blob[i] /= channels;
            }
        }
    }

    if (operation == ReductionOp_MAX)
        return reduction_op< reduction_op_max<float>, reduction_op_max<float> >(bottom_blob, top_blob, -FLT_MAX, dim, coeff, opt);

    if (operation == ReductionOp_MIN)
        return reduction_op< reduction_op_min<float>, reduction_op_min<float> >(bottom_blob, top_blob, FLT_MAX, dim, coeff, opt);

    if (operation == ReductionOp_PROD)
        return reduction_op< std::multiplies<float>, std::multiplies<float> >(bottom_blob, top_blob, 1.f, dim, coeff, opt);

    return 0;
}